

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O0

char * xe::xml::getEscapeEntity(char ch)

{
  char *pcStack_10;
  char ch_local;
  
  switch(ch) {
  case '\0':
    pcStack_10 = "&lt;NUL&gt;";
    break;
  case '\x01':
    pcStack_10 = "&lt;SOH&gt;";
    break;
  case '\x02':
    pcStack_10 = "&lt;STX&gt;";
    break;
  case '\x03':
    pcStack_10 = "&lt;ETX&gt;";
    break;
  case '\x04':
    pcStack_10 = "&lt;EOT&gt;";
    break;
  case '\x05':
    pcStack_10 = "&lt;ENQ&gt;";
    break;
  case '\x06':
    pcStack_10 = "&lt;ACK&gt;";
    break;
  case '\a':
    pcStack_10 = "&lt;BEL&gt;";
    break;
  case '\b':
    pcStack_10 = "&lt;BS&gt;";
    break;
  default:
    pcStack_10 = (char *)0x0;
    break;
  case '\v':
    pcStack_10 = "&lt;VT&gt;";
    break;
  case '\f':
    pcStack_10 = "&lt;FF&gt;";
    break;
  case '\x0e':
    pcStack_10 = "&lt;SO&gt;";
    break;
  case '\x0f':
    pcStack_10 = "&lt;SI&gt;";
    break;
  case '\x10':
    pcStack_10 = "&lt;DLE&gt;";
    break;
  case '\x11':
    pcStack_10 = "&lt;DC1&gt;";
    break;
  case '\x12':
    pcStack_10 = "&lt;DC2&gt;";
    break;
  case '\x13':
    pcStack_10 = "&lt;DC3&gt;";
    break;
  case '\x14':
    pcStack_10 = "&lt;DC4&gt;";
    break;
  case '\x15':
    pcStack_10 = "&lt;NAK&gt;";
    break;
  case '\x16':
    pcStack_10 = "&lt;SYN&gt;";
    break;
  case '\x17':
    pcStack_10 = "&lt;ETB&gt;";
    break;
  case '\x18':
    pcStack_10 = "&lt;CAN&gt;";
    break;
  case '\x19':
    pcStack_10 = "&lt;EM&gt;";
    break;
  case '\x1a':
    pcStack_10 = "&lt;SUB&gt;";
    break;
  case '\x1b':
    pcStack_10 = "&lt;ESC&gt;";
    break;
  case '\x1c':
    pcStack_10 = "&lt;FS&gt;";
    break;
  case '\x1d':
    pcStack_10 = "&lt;GS&gt;";
    break;
  case '\x1e':
    pcStack_10 = "&lt;RS&gt;";
    break;
  case '\x1f':
    pcStack_10 = "&lt;US&gt;";
    break;
  case '\"':
    pcStack_10 = "&quot;";
    break;
  case '&':
    pcStack_10 = "&amp;";
    break;
  case '\'':
    pcStack_10 = "&apos;";
    break;
  case '<':
    pcStack_10 = "&lt;";
    break;
  case '>':
    pcStack_10 = "&gt;";
  }
  return pcStack_10;
}

Assistant:

inline const char* getEscapeEntity (char ch)
{
	switch (ch)
	{
		case '<':	return "&lt;";
		case '>':	return "&gt;";
		case '&':	return "&amp;";
		case '\'':	return "&apos;";
		case '"':	return "&quot;";

		// Non-printable characters.
		case 0:		return "&lt;NUL&gt;";
		case 1:		return "&lt;SOH&gt;";
		case 2:		return "&lt;STX&gt;";
		case 3:		return "&lt;ETX&gt;";
		case 4:		return "&lt;EOT&gt;";
		case 5:		return "&lt;ENQ&gt;";
		case 6:		return "&lt;ACK&gt;";
		case 7:		return "&lt;BEL&gt;";
		case 8:		return "&lt;BS&gt;";
		case 11:	return "&lt;VT&gt;";
		case 12:	return "&lt;FF&gt;";
		case 14:	return "&lt;SO&gt;";
		case 15:	return "&lt;SI&gt;";
		case 16:	return "&lt;DLE&gt;";
		case 17:	return "&lt;DC1&gt;";
		case 18:	return "&lt;DC2&gt;";
		case 19:	return "&lt;DC3&gt;";
		case 20:	return "&lt;DC4&gt;";
		case 21:	return "&lt;NAK&gt;";
		case 22:	return "&lt;SYN&gt;";
		case 23:	return "&lt;ETB&gt;";
		case 24:	return "&lt;CAN&gt;";
		case 25:	return "&lt;EM&gt;";
		case 26:	return "&lt;SUB&gt;";
		case 27:	return "&lt;ESC&gt;";
		case 28:	return "&lt;FS&gt;";
		case 29:	return "&lt;GS&gt;";
		case 30:	return "&lt;RS&gt;";
		case 31:	return "&lt;US&gt;";

		default:	return DE_NULL;
	}
}